

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

string * __thiscall
pbrt::AtomicFloat::ToString_abi_cxx11_(string *__return_storage_ptr__,AtomicFloat *this)

{
  __atomic_base<unsigned_int> local_1c;
  
  local_1c._M_i = (this->bits).super___atomic_base<unsigned_int>._M_i;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float>(__return_storage_ptr__,"%f",(float *)&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::string AtomicFloat::ToString() const {
    return StringPrintf("%f", float(*this));
}